

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fd-socket.c
# Opt level: O0

int fdsocket_outfd_find(void *av,void *bv)

{
  FdSocket *b;
  int a;
  void *bv_local;
  void *av_local;
  
  if (*av < *bv) {
    av_local._4_4_ = -1;
  }
  else if (*bv < *av) {
    av_local._4_4_ = 1;
  }
  else {
    av_local._4_4_ = 0;
  }
  return av_local._4_4_;
}

Assistant:

static int fdsocket_outfd_find(void *av, void *bv)
{
    int a = *(int *)av;
    FdSocket *b = (FdSocket *)bv;
    if (a < b->outfd)
        return -1;
    if (a > b->outfd)
        return +1;
    return 0;
}